

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_HRR_Writer::WriteHRR_Bra_Inline_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  OSTEI_HRR_Algorithm_Base *this_00;
  int __val;
  HRRDoubletStepList brasteps;
  string ket_str;
  string ncart_ket_str;
  allocator local_e1;
  char *local_e0;
  size_type local_d8;
  char local_d0 [8];
  undefined8 uStack_c8;
  HRRDoubletStepList local_c0;
  _Type local_a8;
  undefined8 uStack_a0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  size_type local_80;
  char local_78 [16];
  string local_68;
  string local_48;
  
  __val = NCART((am->qam)._M_elems[2],(am->qam)._M_elems[3]);
  std::__cxx11::to_string(&local_48,__val);
  StringBuilder<char,char_const(&)[2],char_const&>
            (&local_68,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (am->qam)._M_elems[2],
             (char (*) [2])0x139cb8,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (am->qam)._M_elems[3])
  ;
  this_00 = this->hrr_algo_;
  local_a8 = *(_Type *)(am->qam)._M_elems;
  uStack_a0 = 0;
  std::__cxx11::string::string((string *)&local_e0,"",&local_e1);
  local_88._M_p = local_78;
  local_90._0_4_ = local_a8[0];
  local_90._4_4_ = local_a8[1];
  if (local_e0 == local_d0) {
    local_78[8] = (undefined1)uStack_c8;
    local_78[9] = uStack_c8._1_1_;
    local_78[10] = uStack_c8._2_1_;
    local_78[0xb] = uStack_c8._3_1_;
    local_78[0xc] = uStack_c8._4_1_;
    local_78[0xd] = uStack_c8._5_1_;
    local_78[0xe] = uStack_c8._6_1_;
    local_78[0xf] = uStack_c8._7_1_;
  }
  else {
    local_88._M_p = local_e0;
  }
  local_80 = local_d8;
  local_d8 = 0;
  local_d0[0] = '\0';
  local_e0 = local_d0;
  OSTEI_HRR_Algorithm_Base::GetBraSteps(&local_c0,this_00,(DAM *)local_90);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_e0);
  WriteBraSteps_(this,os,&local_c0,&am->tag,&local_48,&local_68);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&local_c0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Bra_Inline_(std::ostream & os, QAM am) const
{
    // ncart_ket in string form
    std::string ncart_ket_str = StringBuilder(NCART(am[2], am[3]));

    // the ket part in string form
    std::string ket_str = StringBuilder(amchar[am[2]], "_", amchar[am[3]]);

    // actually write out the steps now
    auto brasteps = hrr_algo_.GetBraSteps(DAM{am[0], am[1]});
    WriteBraSteps_(os, brasteps, am.tag, ncart_ket_str, ket_str);
}